

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

void __thiscall
Fad<double>::Fad<FadBinaryMinus<Fad<double>,FadCst<double>>>
          (Fad<double> *this,FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *fadexpr)

{
  uint uVar1;
  Fad<double> *pFVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  
  pFVar2 = (fadexpr->fadexpr_).left_;
  this->val_ = pFVar2->val_ - (fadexpr->fadexpr_).right_.constant_;
  Vector<double>::Vector(&this->dx_,(pFVar2->dx_).num_elts);
  this->defaultVal = 0.0;
  pFVar2 = (fadexpr->fadexpr_).left_;
  uVar1 = (pFVar2->dx_).num_elts;
  if (uVar1 != 0) {
    pdVar3 = (this->dx_).ptr_to_data;
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pdVar3[uVar5] = (pFVar2->dx_).ptr_to_data[uVar5];
    }
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }